

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

void __thiscall wasm::MultiMemoryLowering::prepCombinedMemory(MultiMemoryLowering *this)

{
  bool bVar1;
  Module *module;
  Memory *pMVar2;
  uintptr_t uVar3;
  char *pcVar4;
  pointer puVar5;
  Memory *pMVar6;
  address64_t aVar7;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var8;
  pointer puVar9;
  Export *pEVar10;
  pointer puVar11;
  ulong uVar12;
  variant<wasm::Name,_wasm::HeapType> *pvVar13;
  ulong uVar14;
  pointer puVar15;
  ulong uVar16;
  string_view sVar17;
  Fatal local_1b8;
  string_view local_30;
  
  module = this->wasm;
  uVar12 = (this->totalInitialPages).addr;
  puVar15 = (module->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (puVar15->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  uVar3 = (pMVar2->addressType).id;
  (this->pointerType).id = uVar3;
  this->memoryInfo = (uint)(uVar3 != 2);
  bVar1 = pMVar2->shared;
  this->isShared = bVar1;
  pcVar4 = *(char **)((long)&(pMVar2->super_Importable).module + 8);
  this->isImported = pcVar4 != (char *)0x0;
  puVar5 = (module->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar14 = (this->totalMaxPages).addr;
  do {
    if (puVar15 == puVar5) {
      uVar16 = 0x10000;
      if (uVar3 != 2) {
        uVar16 = 0x1000000000000;
      }
      if (uVar16 <= uVar14 - 1) {
        (this->totalMaxPages).addr = 0xffffffffffffffff;
        uVar14 = 0xffffffffffffffff;
      }
      if (uVar14 < uVar12) {
        (this->totalInitialPages).addr = uVar14;
      }
      if (pcVar4 != (char *)0x0) {
        pcVar4 = *(char **)((long)&(pMVar2->super_Importable).module + 8);
        (this->module).super_IString.str._M_len =
             (pMVar2->super_Importable).module.super_IString.str._M_len;
        (this->module).super_IString.str._M_str = pcVar4;
        _Var8._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
             (((module->memories).
               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
        pcVar4 = *(char **)((long)_Var8._M_t.
                                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                  .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x30)
        ;
        (this->base).super_IString.str._M_len =
             *(size_t *)
              ((long)_Var8._M_t.
                     super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                     super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x28);
        (this->base).super_IString.str._M_str = pcVar4;
      }
      puVar11 = (module->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar9 = (module->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (puVar11 == puVar9) {
          Name::Name((Name *)&local_30,"combined_memory");
          sVar17 = (string_view)Names::getValidMemoryName(module,(Name)local_30);
          (this->combinedMemory).super_IString.str = sVar17;
          return;
        }
        pEVar10 = (puVar11->_M_t).
                  super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                  super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        if (pEVar10->kind == Memory) {
          if (*(__index_type *)
               ((long)&(pEVar10->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) ==
              '\0') {
            pvVar13 = &pEVar10->value;
          }
          else {
            pvVar13 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
          }
          if (*(long *)((long)&(pvVar13->super__Variant_base<wasm::Name,_wasm::HeapType>).
                               super__Move_assign_alias<wasm::Name,_wasm::HeapType> + 8) !=
              *(long *)((long)(((module->memories).
                                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                              super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                              ._M_t + 8)) {
            Fatal::Fatal(&local_1b8);
            Fatal::operator<<(&local_1b8,
                              (char (*) [59])
                              "MultiMemoryLowering: only the first memory can be exported");
LAB_00aaf872:
            Fatal::~Fatal(&local_1b8);
          }
          this->isExported = true;
        }
        puVar11 = puVar11 + 1;
      } while( true );
    }
    pMVar6 = (puVar15->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    if (pMVar6->shared != bVar1) {
      __assert_fail("memory->shared == isShared",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MultiMemoryLowering.cpp"
                    ,0x1b9,"void wasm::MultiMemoryLowering::prepCombinedMemory()");
    }
    if ((pMVar6->addressType).id != uVar3) {
      __assert_fail("memory->addressType == pointerType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MultiMemoryLowering.cpp"
                    ,0x1ba,"void wasm::MultiMemoryLowering::prepCombinedMemory()");
    }
    if ((*(char **)((long)&(pMVar6->super_Importable).super_Named + 8) !=
         *(char **)((long)&(pMVar2->super_Importable).super_Named + 8)) &&
       (*(char **)((long)&(pMVar6->super_Importable).module + 8) != (char *)0x0)) {
      Fatal::Fatal(&local_1b8);
      Fatal::operator<<(&local_1b8,
                        (char (*) [59])"MultiMemoryLowering: only the first memory can be imported")
      ;
      goto LAB_00aaf872;
    }
    uVar12 = uVar12 + (pMVar6->initial).addr;
    (this->totalInitialPages).addr = uVar12;
    aVar7 = (pMVar6->max).addr;
    if (aVar7 != 0xffffffffffffffff) {
      uVar14 = uVar14 + aVar7;
      (this->totalMaxPages).addr = uVar14;
    }
    puVar15 = puVar15 + 1;
  } while( true );
}

Assistant:

void prepCombinedMemory() {
    pointerType = getFirstMemory().addressType;
    memoryInfo = pointerType == Type::i32 ? Builder::MemoryInfo::Memory32
                                          : Builder::MemoryInfo::Memory64;
    isShared = getFirstMemory().shared;
    isImported = getFirstMemory().imported();
    for (auto& memory : wasm->memories) {
      // We are assuming that each memory is configured the same as the first
      // and assert if any of the memories does not match this configuration
      assert(memory->shared == isShared);
      assert(memory->addressType == pointerType);

      // TODO: handle memory import for memories other than the first
      if (memory->name != getFirstMemory().name && memory->imported()) {
        Fatal() << "MultiMemoryLowering: only the first memory can be imported";
      }

      // Calculating the total initial and max page size for the combined memory
      // by totaling the initial and max page sizes for the memories in the
      // module
      totalInitialPages = totalInitialPages + memory->initial;
      if (memory->hasMax()) {
        totalMaxPages = totalMaxPages + memory->max;
      }
    }
    // Ensuring valid initial and max page sizes that do not exceed the number
    // of pages addressable by the pointerType
    Address maxSize =
      pointerType == Type::i32 ? Memory::kMaxSize32 : Memory::kMaxSize64;
    if (totalMaxPages > maxSize || totalMaxPages == 0) {
      totalMaxPages = Memory::kUnlimitedSize;
    }
    if (totalInitialPages > totalMaxPages) {
      totalInitialPages = totalMaxPages;
    }

    // Save the module and base to set on the combinedMemory
    if (isImported) {
      module = getFirstMemory().module;
      base = getFirstMemory().base;
    }
    // Ensuring only the first memory is an exported memory
    for (auto& exp : wasm->exports) {
      if (exp->kind == ExternalKind::Memory &&
          *exp->getInternalName() == getFirstMemory().name) {
        isExported = true;
      } else if (exp->kind == ExternalKind::Memory) {
        Fatal() << "MultiMemoryLowering: only the first memory can be exported";
      }
    }
    // Creating the combined memory name so we can reference the combined memory
    // in subsequent instructions before it is added to the module
    combinedMemory = Names::getValidMemoryName(*wasm, "combined_memory");
  }